

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

void __thiscall QNetworkProxy::setType(QNetworkProxy *this,ProxyType type)

{
  long lVar1;
  Capabilities CVar2;
  QNetworkProxyPrivate *pQVar3;
  ProxyType in_ESI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QSharedDataPointer<QNetworkProxyPrivate>::operator->
                     ((QSharedDataPointer<QNetworkProxyPrivate> *)
                      CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
  pQVar3->type = in_ESI;
  pQVar3 = QSharedDataPointer<QNetworkProxyPrivate>::operator->
                     ((QSharedDataPointer<QNetworkProxyPrivate> *)
                      CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
  if ((pQVar3->capabilitiesSet & 1U) == 0) {
    CVar2 = defaultCapabilitiesForType(DefaultProxy);
    pQVar3 = QSharedDataPointer<QNetworkProxyPrivate>::operator->
                       ((QSharedDataPointer<QNetworkProxyPrivate> *)
                        CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
    (pQVar3->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
    super_QFlagsStorage<QNetworkProxy::Capability>.i =
         (Int)CVar2.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
              super_QFlagsStorage<QNetworkProxy::Capability>.i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkProxy::setType(QNetworkProxy::ProxyType type)
{
    d->type = type;
    if (!d->capabilitiesSet)
        d->capabilities = defaultCapabilitiesForType(type);
}